

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coloredpointcloud.cc
# Opt level: O2

void __thiscall gvr::ColoredPointCloud::saveSTL(ColoredPointCloud *this,char *name)

{
  IOException *this_00;
  allocator local_39;
  string local_38;
  
  this_00 = (IOException *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string
            ((string *)&local_38,
             "Cannot store colored point cloud in STL format. STL is a triangle format.",&local_39);
  gutil::IOException::IOException(this_00,&local_38);
  __cxa_throw(this_00,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
}

Assistant:

void ColoredPointCloud::saveSTL(const char *name) const
{
  throw gutil::IOException("Cannot store colored point cloud in STL format. STL is a triangle format.");
}